

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float __thiscall
ImGui::RoundScalarWithFormatT<float,float>(ImGui *this,char *format,ImGuiDataType data_type,float v)

{
  ImGui IVar1;
  char cVar2;
  double dVar3;
  ImGui *in_RAX;
  ImGui *pIVar4;
  char cVar5;
  int iVar6;
  undefined4 in_register_00000014;
  size_t fmt_out_size;
  long lVar7;
  char *__nptr;
  char *pcVar8;
  char fmt_sanitized [32];
  char v_str [64];
  char local_78 [32];
  char local_58 [64];
  
  fmt_out_size = CONCAT44(in_register_00000014,data_type);
  do {
    IVar1 = *this;
    fmt_out_size = CONCAT71((int7)(fmt_out_size >> 8),IVar1);
    if (IVar1 == (ImGui)0x0) {
      iVar6 = 3;
      pIVar4 = in_RAX;
    }
    else if ((IVar1 != (ImGui)0x25) || (iVar6 = 1, pIVar4 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar1 == (ImGui)0x25) + 1;
      iVar6 = 0;
      pIVar4 = in_RAX;
    }
    in_RAX = pIVar4;
  } while (iVar6 == 0);
  if (iVar6 == 1) {
    this = pIVar4;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    SanitizeFormatString((char *)this,local_78,fmt_out_size);
    ImFormatString(local_58,0x40,local_78,SUB84((double)v,0));
    pcVar8 = local_58;
    do {
      __nptr = pcVar8;
      cVar2 = *__nptr;
      pcVar8 = __nptr + 1;
    } while (cVar2 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      dVar3 = atof(__nptr);
      v = (float)dVar3;
    }
    else {
      lVar7 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
      cVar5 = __nptr[lVar7];
      v = 0.0;
      if ((byte)(cVar5 - 0x30U) < 10) {
        pcVar8 = __nptr + 1 + lVar7;
        do {
          v = v * 10.0 + (float)(byte)(cVar5 - 0x30);
          cVar5 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while ((byte)(cVar5 - 0x30U) < 10);
      }
      if (cVar2 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}